

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

xmlChar * xmlResolveResourceFromCatalog(char *URL,char *ID,xmlParserCtxtPtr ctxt)

{
  bool bVar1;
  bool bVar2;
  xmlCatalogAllow xVar3;
  int iVar4;
  xmlChar *local_48;
  xmlChar *tmp;
  int allowGlobal;
  int allowLocal;
  xmlCatalogAllow pref;
  xmlChar *resource;
  xmlParserCtxtPtr ctxt_local;
  char *ID_local;
  char *URL_local;
  
  _allowLocal = (xmlChar *)0x0;
  bVar1 = false;
  bVar2 = false;
  if ((ctxt == (xmlParserCtxtPtr)0x0) || (ctxt->html == 0)) {
    xVar3 = xmlCatalogGetDefaults();
    if (((ctxt != (xmlParserCtxtPtr)0x0) && (ctxt->catalogs != (void *)0x0)) &&
       ((xVar3 == XML_CATA_ALLOW_ALL || (xVar3 == XML_CATA_ALLOW_DOCUMENT)))) {
      bVar1 = true;
    }
    if (((ctxt == (xmlParserCtxtPtr)0x0) || ((ctxt->options & 0x2000000U) == 0)) &&
       ((xVar3 == XML_CATA_ALLOW_ALL || (xVar3 == XML_CATA_ALLOW_GLOBAL)))) {
      bVar2 = true;
    }
    if ((xVar3 != XML_CATA_ALLOW_NONE) && (iVar4 = xmlNoNetExists(URL), iVar4 == 0)) {
      if (bVar1) {
        _allowLocal = xmlCatalogLocalResolve(ctxt->catalogs,(xmlChar *)ID,(xmlChar *)URL);
      }
      if ((_allowLocal == (xmlChar *)0x0) && (bVar2)) {
        _allowLocal = xmlCatalogResolve((xmlChar *)ID,(xmlChar *)URL);
      }
      if ((_allowLocal == (xmlChar *)0x0) && (URL != (char *)0x0)) {
        _allowLocal = xmlStrdup((xmlChar *)URL);
      }
      if ((_allowLocal != (xmlChar *)0x0) &&
         (iVar4 = xmlNoNetExists((char *)_allowLocal), iVar4 == 0)) {
        local_48 = (xmlChar *)0x0;
        if (bVar1) {
          local_48 = xmlCatalogLocalResolveURI(ctxt->catalogs,_allowLocal);
        }
        if ((local_48 == (xmlChar *)0x0) && (bVar2)) {
          local_48 = xmlCatalogResolveURI(_allowLocal);
        }
        if (local_48 != (xmlChar *)0x0) {
          (*xmlFree)(_allowLocal);
          _allowLocal = local_48;
        }
      }
    }
    URL_local = (char *)_allowLocal;
  }
  else {
    URL_local = (char *)0x0;
  }
  return (xmlChar *)URL_local;
}

Assistant:

static xmlChar *
xmlResolveResourceFromCatalog(const char *URL, const char *ID,
                              xmlParserCtxtPtr ctxt) {
    xmlChar *resource = NULL;
    xmlCatalogAllow pref;
    int allowLocal = 0;
    int allowGlobal = 0;

    /*
     * Loading of HTML documents shouldn't use XML catalogs.
     */
    if ((ctxt != NULL) && (ctxt->html))
        return(NULL);

    /*
     * If the resource doesn't exists as a file,
     * try to load it from the resource pointed in the catalogs
     */
    pref = xmlCatalogGetDefaults();

    if ((ctxt != NULL) && (ctxt->catalogs != NULL) &&
        ((pref == XML_CATA_ALLOW_ALL) ||
         (pref == XML_CATA_ALLOW_DOCUMENT)))
        allowLocal = 1;

    if (((ctxt == NULL) ||
         ((ctxt->options & XML_PARSE_NO_SYS_CATALOG) == 0)) &&
        ((pref == XML_CATA_ALLOW_ALL) ||
         (pref == XML_CATA_ALLOW_GLOBAL)))
        allowGlobal = 1;

    if ((pref != XML_CATA_ALLOW_NONE) && (!xmlNoNetExists(URL))) {
	/*
	 * Do a local lookup
	 */
        if (allowLocal) {
	    resource = xmlCatalogLocalResolve(ctxt->catalogs,
					      (const xmlChar *)ID,
					      (const xmlChar *)URL);
        }
	/*
	 * Try a global lookup
	 */
	if ((resource == NULL) && (allowGlobal)) {
	    resource = xmlCatalogResolve((const xmlChar *)ID,
					 (const xmlChar *)URL);
	}
	if ((resource == NULL) && (URL != NULL))
	    resource = xmlStrdup((const xmlChar *) URL);

	/*
	 * TODO: do an URI lookup on the reference
	 */
	if ((resource != NULL) && (!xmlNoNetExists((const char *)resource))) {
	    xmlChar *tmp = NULL;

	    if (allowLocal) {
		tmp = xmlCatalogLocalResolveURI(ctxt->catalogs, resource);
	    }
	    if ((tmp == NULL) && (allowGlobal)) {
		tmp = xmlCatalogResolveURI(resource);
	    }

	    if (tmp != NULL) {
		xmlFree(resource);
		resource = tmp;
	    }
	}
    }

    return resource;
}